

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::createSchemaElementDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,bool *isDuplicate,XMLCh **valConstraint
          ,bool topLevel)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  XMLCh *str1;
  undefined4 extraout_var;
  SchemaElementDecl *pSVar4;
  Janitor<xercesc_4_0::SchemaElementDecl> local_60;
  Janitor<xercesc_4_0::SchemaElementDecl> elemDecl;
  SchemaElementDecl *other;
  XMLCh *elemForm;
  uint local_40;
  int uriIndex;
  uint enclosingScope;
  bool topLevel_local;
  XMLCh **valConstraint_local;
  bool *isDuplicate_local;
  XMLCh *name_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  local_40 = this->fCurrentScope;
  elemForm._4_4_ = this->fEmptyNamespaceURI;
  if (topLevel) {
    elemForm._4_4_ = this->fTargetNSURI;
    local_40 = 0xfffffffe;
  }
  else {
    str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FORM,UnKnown);
    if ((((str1 == (XMLCh *)0x0) || (*str1 == L'\0')) &&
        (uVar2 = SchemaInfo::getElemAttrDefaultQualified(this->fSchemaInfo), (uVar2 & 1) != 0)) ||
       (bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_QUALIFIED), bVar1)) {
      elemForm._4_4_ = this->fTargetNSURI;
    }
    iVar3 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)elemForm._4_4_,name,0,(ulong)local_40);
    if ((SchemaElementDecl *)CONCAT44(extraout_var,iVar3) != (SchemaElementDecl *)0x0) {
      *isDuplicate = true;
      return (SchemaElementDecl *)CONCAT44(extraout_var,iVar3);
    }
    elemDecl.fData = (SchemaElementDecl *)0x0;
  }
  pSVar4 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fGrammarPoolMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (pSVar4,L"",name,elemForm._4_4_,Any,local_40,this->fGrammarPoolMemoryManager);
  Janitor<xercesc_4_0::SchemaElementDecl>::Janitor(&local_60,pSVar4);
  pSVar4 = Janitor<xercesc_4_0::SchemaElementDecl>::operator->(&local_60);
  XMLElementDecl::setCreateReason(&pSVar4->super_XMLElementDecl,Declared);
  if (topLevel) {
    pSVar4 = Janitor<xercesc_4_0::SchemaElementDecl>::operator->(&local_60);
    SchemaElementDecl::setPSVIScope(pSVar4,SCP_GLOBAL);
  }
  pSVar4 = Janitor<xercesc_4_0::SchemaElementDecl>::get(&local_60);
  processElemDeclAttrs(this,elem,pSVar4,valConstraint,topLevel);
  pSVar4 = Janitor<xercesc_4_0::SchemaElementDecl>::release(&local_60);
  Janitor<xercesc_4_0::SchemaElementDecl>::~Janitor(&local_60);
  return pSVar4;
}

Assistant:

SchemaElementDecl*
TraverseSchema::createSchemaElementDecl(const DOMElement* const elem,
                                        const XMLCh* const name,
                                        bool& isDuplicate,
                                        const XMLCh*& valConstraint,
                                        const bool topLevel)
{
    unsigned int enclosingScope = fCurrentScope;
    int uriIndex = fEmptyNamespaceURI;

    if (topLevel) {

        uriIndex = fTargetNSURI;
        enclosingScope = Grammar::TOP_LEVEL_SCOPE;
    }
    else
    {
        const XMLCh* elemForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);

        if (((!elemForm || !*elemForm) &&
            (fSchemaInfo->getElemAttrDefaultQualified() & Elem_Def_Qualified))
            || XMLString::equals(elemForm,SchemaSymbols::fgATTVAL_QUALIFIED))
            uriIndex = fTargetNSURI;

        // Check for duplicate elements
        SchemaElementDecl* other = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(uriIndex, name, 0, enclosingScope);

        if (other != 0)
        {
            isDuplicate = true;
            return other;
        }
    }

    // create element decl and add it to the grammar
    Janitor<SchemaElementDecl>    elemDecl(new (fGrammarPoolMemoryManager) SchemaElementDecl(
        XMLUni::fgZeroLenString , name, uriIndex , SchemaElementDecl::Any
        , enclosingScope , fGrammarPoolMemoryManager
    ));

    elemDecl->setCreateReason(XMLElementDecl::Declared);

    if (topLevel)
        elemDecl->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    // process attributes
    processElemDeclAttrs(elem, elemDecl.get(), valConstraint, topLevel);

    return elemDecl.release();
}